

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O2

void __thiscall
reader_authority_suite::test_ipv6_line_7a_v6::test_method(test_ipv6_line_7a_v6 *this)

{
  undefined4 local_100;
  value local_fc;
  view_type local_f8;
  undefined8 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char input [18];
  authority reader;
  
  local_f8.ptr_ = input;
  builtin_strncpy(input,"[1111::1234:5678]",0x12);
  local_f8.len_ = strlen(local_f8.ptr_);
  trial::url::reader::basic_authority<char>::basic_authority(&reader,&local_f8);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x159);
  local_f8.len_ = local_f8.len_ & 0xffffffffffffff00;
  local_f8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_a0 = "";
  local_fc = reader.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_100 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_f8,&local_a8,0x159,2,2,&local_fc,"reader.subcode()",&local_100,
             "url::token::subcode::authority_host_ipv6");
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x15a);
  local_f8.len_ = local_f8.len_ & 0xffffffffffffff00;
  local_f8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_d0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[16]>
            (&local_f8,&local_d8,0x15a,2,2,
             &reader.super_base<char,_trial::url::reader::basic_authority>.current_view,
             "reader.literal()","1111::1234:5678","\"1111::1234:5678\"");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv6_line_7a_v6)
{
    const char input[] = "[1111::1234:5678]";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv6);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1111::1234:5678");
}